

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O1

void __thiscall
ctemplate::PreEscape::Modify
          (PreEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  long lVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar7 = in;
  if (0 < (long)inlen) {
    pcVar5 = in;
LAB_0012abe4:
    pcVar7 = pcVar5;
    lVar6 = 0;
    do {
      bVar1 = pcVar7[lVar6];
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          if (pcVar7 < pcVar7 + lVar6) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar6);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 6;
          pcVar5 = "&quot;";
          goto LAB_0012ad00;
        }
        if (bVar1 == 0x26) {
          if (pcVar7 < pcVar7 + lVar6) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar6);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 5;
          pcVar5 = "&amp;";
          goto LAB_0012ad00;
        }
      }
      else {
        if (bVar1 == 0x27) {
          if (pcVar7 < pcVar7 + lVar6) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar6);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 5;
          pcVar5 = "&#39;";
          goto LAB_0012ad00;
        }
        if (bVar1 == 0x3c) {
          if (pcVar7 < pcVar7 + lVar6) {
            (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar6);
          }
          pp_Var3 = out->_vptr_ExpandEmitter;
          uVar4 = 4;
          pcVar5 = "&lt;";
          goto LAB_0012ad00;
        }
        if (bVar1 == 0x3e) goto LAB_0012ac2b;
      }
      lVar2 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      if (in + inlen <= pcVar7 + lVar2) {
        in = pcVar7 + lVar6;
        break;
      }
    } while( true );
  }
LAB_0012ad29:
  if (in <= pcVar7) {
    return;
  }
  (*out->_vptr_ExpandEmitter[5])(out,pcVar7,(long)in - (long)pcVar7);
  return;
LAB_0012ac2b:
  if (pcVar7 < pcVar7 + lVar6) {
    (*out->_vptr_ExpandEmitter[5])(out,pcVar7,lVar6);
  }
  pp_Var3 = out->_vptr_ExpandEmitter;
  uVar4 = 4;
  pcVar5 = "&gt;";
LAB_0012ad00:
  (*pp_Var3[5])(out,pcVar5,uVar4);
  pcVar5 = pcVar7 + lVar6 + 1;
  if (in + inlen <= pcVar7 + lVar6 + 1) goto code_r0x0012ad13;
  goto LAB_0012abe4;
code_r0x0012ad13:
  in = pcVar7 + lVar6 + 1;
  pcVar7 = in;
  goto LAB_0012ad29;
}

Assistant:

void PreEscape::Modify(const char* in, size_t inlen,
                       const PerExpandData*,
                       ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit)  {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      // Unlike HtmlEscape, we leave whitespace as is.
      case '&':  EmitRun(start, pos, out); APPEND("&amp;");  break;
      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '<':  EmitRun(start, pos, out); APPEND("&lt;");   break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}